

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O2

FT_Error tt_property_set(FT_Module module,char *property_name,void *value,FT_Bool value_is_string)

{
  int iVar1;
  FT_Error FVar2;
  long lVar3;
  char *s;
  
  iVar1 = strcmp(property_name,"interpreter-version");
  if (iVar1 == 0) {
    if (value_is_string == '\0') {
      iVar1 = *value;
    }
    else {
      lVar3 = strtol((char *)value,(char **)0x0,10);
      iVar1 = (int)lVar3;
    }
    if ((iVar1 == 0x28) || (iVar1 == 0x23)) {
      *(int *)&module[5].clazz = iVar1;
      FVar2 = 0;
    }
    else {
      FVar2 = 7;
    }
  }
  else {
    FVar2 = 0xc;
  }
  return FVar2;
}

Assistant:

static FT_Error
  tt_property_set( FT_Module    module,         /* TT_Driver */
                   const char*  property_name,
                   const void*  value,
                   FT_Bool      value_is_string )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Driver  driver = (TT_Driver)module;

#ifndef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
    FT_UNUSED( value_is_string );
#endif


    if ( !ft_strcmp( property_name, "interpreter-version" ) )
    {
      FT_UInt  interpreter_version;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
      {
        const char*  s = (const char*)value;


        interpreter_version = (FT_UInt)ft_strtol( s, NULL, 10 );
      }
      else
#endif
      {
        FT_UInt*  iv = (FT_UInt*)value;


        interpreter_version = *iv;
      }

      if ( interpreter_version == TT_INTERPRETER_VERSION_35
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
           || interpreter_version == TT_INTERPRETER_VERSION_38
#endif
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
           || interpreter_version == TT_INTERPRETER_VERSION_40
#endif
         )
        driver->interpreter_version = interpreter_version;
      else
        error = FT_ERR( Unimplemented_Feature );

      return error;
    }

    FT_TRACE2(( "tt_property_set: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }